

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpull.c
# Opt level: O1

int nn_xpull_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_fq_data *data;
  int rcvprio;
  size_t sz;
  int local_24;
  size_t local_20;
  
  local_20 = 4;
  nn_pipe_getopt(pipe,0,9,&local_24,&local_20);
  if (local_20 == 4) {
    if (0xffffffef < local_24 - 0x11U) {
      data = (nn_fq_data *)nn_alloc_(0x20);
      if (data != (nn_fq_data *)0x0) {
        nn_pipe_setdata(pipe,data);
        nn_fq_add((nn_fq *)(self + 1),data,pipe,local_24);
        return 0;
      }
      goto LAB_00153a07;
    }
  }
  else {
    nn_xpull_add_cold_1();
  }
  nn_xpull_add_cold_3();
LAB_00153a07:
  nn_xpull_add_cold_2();
}

Assistant:

static int nn_xpull_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpull *xpull;
    struct nn_xpull_data *data;
    int rcvprio;
    size_t sz;

    xpull = nn_cont (self, struct nn_xpull, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xpull_data), "pipe data (pull)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_fq_add (&xpull->fq, &data->fq, pipe, rcvprio);

    return 0;
}